

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseWheel(void)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float scroll_amount_1;
  float scroll_amount;
  ImVec2 offset;
  float scale;
  float new_font_scale;
  bool scroll_allowed;
  ImGuiWindow *scroll_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  byte local_4e;
  ImVec2 local_2c;
  float local_24;
  float local_20;
  byte local_19;
  ImGuiWindow *local_18;
  ImGuiWindow *local_10;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  if (((GImGui->HoveredWindow != (ImGuiWindow *)0x0) &&
      ((GImGui->HoveredWindow->Collapsed & 1U) == 0)) &&
     ((fVar4 = (GImGui->IO).MouseWheel, fVar4 != 0.0 ||
      (((NAN(fVar4) || (fVar4 = (GImGui->IO).MouseWheelH, fVar4 != 0.0)) || (NAN(fVar4))))))) {
    local_10 = GImGui->HoveredWindow;
    local_18 = local_10;
    while( true ) {
      bVar1 = false;
      if ((((local_18->Flags & 0x1000000U) != 0) && (bVar1 = false, (local_18->Flags & 0x10U) != 0))
         && ((bVar1 = false, (local_18->Flags & 8U) == 0 &&
             (bVar1 = false, (local_18->Flags & 0x200U) == 0)))) {
        bVar1 = local_18->ParentWindow != (ImGuiWindow *)0x0;
      }
      if (!bVar1) break;
      local_18 = local_18->ParentWindow;
    }
    local_4e = 0;
    if ((local_18->Flags & 0x10U) == 0) {
      local_4e = (local_18->Flags & 0x200U) != 0 ^ 0xff;
    }
    local_19 = local_4e & 1;
    fVar4 = (GImGui->IO).MouseWheel;
    if ((fVar4 != 0.0) || (NAN(fVar4))) {
      if ((((GImGui->IO).KeyCtrl & 1U) == 0) || (((GImGui->IO).FontAllowUserScaling & 1U) == 0)) {
        if ((((GImGui->IO).KeyCtrl & 1U) == 0) && (local_19 != 0)) {
          fVar2 = ImGuiWindow::CalcFontSize(local_18);
          fVar2 = fVar2 * 5.0;
          fVar3 = ImRect::GetHeight(&local_18->ContentsRegionRect);
          fVar4 = (local_18->WindowPadding).y;
          fVar4 = ImMin<float>(fVar2,(fVar4 + fVar4 + fVar3) * 0.67);
          SetWindowScrollY(local_18,-(local_8->IO).MouseWheel * (float)(int)fVar4 +
                                    (local_18->Scroll).y);
        }
      }
      else {
        local_20 = ImClamp<float>((GImGui->IO).MouseWheel * 0.1 + local_10->FontWindowScale,0.5,2.5)
        ;
        local_24 = local_20 / local_10->FontWindowScale;
        local_10->FontWindowScale = local_20;
        operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0.0);
        operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                  (ImVec2 *)0x125e77);
        operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                  (ImVec2 *)0x125e8c);
        local_2c = operator/((ImVec2 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                             ,(ImVec2 *)0x125ea5);
        operator+=(&local_10->Pos,&local_2c);
        operator*=(&local_10->Size,local_24);
        operator*=(&local_10->SizeFull,local_24);
      }
    }
    fVar4 = (local_8->IO).MouseWheelH;
    if ((((fVar4 != 0.0) || (NAN(fVar4))) && ((local_19 & 1) != 0)) &&
       (((local_8->IO).KeyCtrl & 1U) == 0)) {
      fVar4 = ImGuiWindow::CalcFontSize(local_18);
      SetWindowScrollX(local_18,-(local_8->IO).MouseWheelH * fVar4 + (local_18->Scroll).x);
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseWheel()
{
    ImGuiContext& g = *GImGui;
    if (!g.HoveredWindow || g.HoveredWindow->Collapsed)
        return;
    if (g.IO.MouseWheel == 0.0f && g.IO.MouseWheelH == 0.0f)
        return;

    // If a child window has the ImGuiWindowFlags_NoScrollWithMouse flag, we give a chance to scroll its parent (unless either ImGuiWindowFlags_NoInputs or ImGuiWindowFlags_NoScrollbar are also set).
    ImGuiWindow* window = g.HoveredWindow;
    ImGuiWindow* scroll_window = window;
    while ((scroll_window->Flags & ImGuiWindowFlags_ChildWindow) && (scroll_window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(scroll_window->Flags & ImGuiWindowFlags_NoScrollbar) && !(scroll_window->Flags & ImGuiWindowFlags_NoMouseInputs) && scroll_window->ParentWindow)
        scroll_window = scroll_window->ParentWindow;
    const bool scroll_allowed = !(scroll_window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(scroll_window->Flags & ImGuiWindowFlags_NoMouseInputs);

    if (g.IO.MouseWheel != 0.0f)
    {
        if (g.IO.KeyCtrl && g.IO.FontAllowUserScaling)
        {
            // Zoom / Scale window
            const float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
            const float scale = new_font_scale / window->FontWindowScale;
            window->FontWindowScale = new_font_scale;

            const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
            window->Pos += offset;
            window->Size *= scale;
            window->SizeFull *= scale;
        }
        else if (!g.IO.KeyCtrl && scroll_allowed)
        {
            // Mouse wheel vertical scrolling
            float scroll_amount = 5 * scroll_window->CalcFontSize();
            scroll_amount = (float)(int)ImMin(scroll_amount, (scroll_window->ContentsRegionRect.GetHeight() + scroll_window->WindowPadding.y * 2.0f) * 0.67f);
            SetWindowScrollY(scroll_window, scroll_window->Scroll.y - g.IO.MouseWheel * scroll_amount);
        }
    }
    if (g.IO.MouseWheelH != 0.0f && scroll_allowed && !g.IO.KeyCtrl)
    {
        // Mouse wheel horizontal scrolling (for hardware that supports it)
        float scroll_amount = scroll_window->CalcFontSize();
        SetWindowScrollX(scroll_window, scroll_window->Scroll.x - g.IO.MouseWheelH * scroll_amount);
    }
}